

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::update
          (Model *this,vector<int,_std::allocator<int>_> *input,
          vector<int,_std::allocator<int>_> *targets,int32_t targetIndex,real lr,int32_t id)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  real *prVar4;
  element_type *peVar5;
  const_iterator this_00;
  const_iterator vec;
  int in_ECX;
  vector<int,_std::allocator<int>_> *in_RDX;
  Model *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_XMM0_Da;
  real rVar6;
  undefined1 auVar7 [16];
  const_iterator it;
  real weight;
  element_type *in_stack_ffffffffffffffa8;
  Matrix *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  real a;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffd0;
  int32_t targetIndex_00;
  
  a = (real)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  sVar3 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)in_RSI);
  if (sVar3 != 0) {
    computeHidden(in_RSI,in_RDX,(Vector *)CONCAT44(in_ECX,in_XMM0_Da));
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x17b3e5);
    prVar4 = Matrix::at(in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,0x17b3f6);
    targetIndex_00 = (int32_t)((ulong)in_stack_ffffffffffffffd0._M_current >> 0x20);
    if (in_ECX == -1) {
      rVar6 = computeLoss((Model *)CONCAT44(0xffffffff,in_XMM0_Da),
                          (vector<int,_std::allocator<int>_> *)CONCAT44(in_R8D,*prVar4),
                          targetIndex_00,SUB84(in_stack_ffffffffffffffd0._M_current,0));
      fVar1 = rVar6 + *(float *)(in_RDI + 0xb0);
      *(float *)(in_RDI + 0xb0) = fVar1;
    }
    else {
      if (in_ECX < 0) {
        __assert_fail("targetIndex >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/model.cc"
                      ,0x154,
                      "void fasttext::Model::update(const std::vector<int32_t> &, const std::vector<int32_t> &, int32_t, real, int32_t)"
                     );
      }
      if (*(int *)(in_RDI + 0xac) <= in_ECX) {
        __assert_fail("targetIndex < osz_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/model.cc"
                      ,0x155,
                      "void fasttext::Model::update(const std::vector<int32_t> &, const std::vector<int32_t> &, int32_t, real, int32_t)"
                     );
      }
      rVar6 = computeLoss((Model *)CONCAT44(in_ECX,in_XMM0_Da),
                          (vector<int,_std::allocator<int>_> *)CONCAT44(in_R8D,*prVar4),
                          targetIndex_00,SUB84(in_stack_ffffffffffffffd0._M_current,0));
      fVar1 = rVar6 + *(float *)(in_RDI + 0xb0);
      *(float *)(in_RDI + 0xb0) = fVar1;
    }
    auVar7 = ZEXT416((uint)fVar1);
    *(long *)(in_RDI + 0xb8) = *(long *)(in_RDI + 0xb8) + 1;
    peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x17b4ef);
    if (peVar5->model == sup) {
      in_stack_ffffffffffffffb8 = in_RDI + 0x90;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)in_RSI);
      vcvtusi2sd_avx512f(auVar7,sVar3);
      Vector::mul((Vector *)in_stack_ffffffffffffffd0._M_current,a);
    }
    this_00 = std::vector<int,_std::allocator<int>_>::cbegin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8);
    while( true ) {
      vec = std::vector<int,_std::allocator<int>_>::cend
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffb0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffa8);
      if (!bVar2) break;
      in_stack_ffffffffffffffa8 =
           std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17b56f);
      in_stack_ffffffffffffffb0 = (Matrix *)(in_RDI + 0x90);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffd0);
      Matrix::addRow((Matrix *)this_00._M_current,(Vector *)vec._M_current,in_RDI,
                     (real)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void Model::update(
		const std::vector<int32_t>& input,
		const std::vector<int32_t>& targets,
		int32_t targetIndex,
		real lr,
		int32_t id) {
	if (input.size() == 0) {
		return;
	}
	computeHidden(input, hidden_);
	real weight = weights_->at(id,0);
	// std::cout << "weighted" << weight << " " <<id << std::endl;
	if (targetIndex == kAllLabelsAsTarget) {
		loss_ += computeLoss(targets, -1, lr*weight);
	} else {
		assert(targetIndex >= 0);
		assert(targetIndex < osz_);
		loss_ += computeLoss(targets, targetIndex, lr*weight);
	}

	nexamples_ += 1;

	if (args_->model == model_name::sup) {
		grad_.mul(1.0 / input.size());
	}
	// if(nexamples_==1000000)
	// 	std::cout << "START TO TRAIN THE EMBEDDINGS;" << std::endl;
	// if(nexamples_>1000000)
	// {
	for (auto it = input.cbegin(); it != input.cend(); ++it) {
		wi_->addRow(grad_, *it, 1.0);
	}
	// }
}